

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MPP_RET h264e_vepu_mbrc_prepare(HalH264eVepuMbRcCtx ctx,HalH264eVepuMbRc *mbrc,EncRcTask *rc_task)

{
  undefined4 uVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  int iVar4;
  int local_78;
  int local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  RK_S32 coeffCntMax;
  RK_S32 nonZeroTarget;
  RK_S32 tmp;
  RK_S32 srcPrm;
  RK_S32 scaler;
  RK_S32 sscale;
  RK_S32 i;
  EncRcTaskInfo *info;
  EncFrmStatus *frm;
  HalH264eVepuMbRcImpl *p;
  EncRcTask *rc_task_local;
  HalH264eVepuMbRc *mbrc_local;
  HalH264eVepuMbRcCtx ctx_local;
  
  local_6c = *(int *)((long)ctx + 0x14) * 0x180;
  mbrc->qp_init = (rc_task->info).quality_target;
  mbrc->qp_min = (rc_task->info).quality_min;
  mbrc->qp_max = (rc_task->info).quality_max;
  mbrc->mad_qp_change = 0;
  mbrc->mad_threshold = 0;
  mbrc->cp_distance_mbs = 0;
  if (*(int *)((long)ctx + 0x1c) != 0) {
    *(undefined4 *)((long)ctx + 0x54) = *(undefined4 *)((long)ctx + 0x50);
    uVar1 = 0;
    if (((rc_task->frm).val >> 4 & 1) != 0) {
      uVar1 = 2;
    }
    *(undefined4 *)((long)ctx + 0x50) = uVar1;
    if (mbrc->rlc_count == 0) {
      mbrc->rlc_count = 1;
    }
    RVar2 = axb_div_c(mbrc->out_strm_size << 3,0x100,mbrc->rlc_count);
    if ((((rc_task->frm).val >> 4 & 1) == 0) && (RVar2 != 0)) {
      local_68 = axb_div_c((rc_task->info).bit_target,0x100,RVar2);
      local_64 = local_68;
      if ((int)local_68 < 0) {
        local_64 = 0;
      }
      if ((int)local_64 < (int)local_6c) {
        if ((int)local_68 < 0) {
          local_68 = 0;
        }
        local_6c = local_68;
      }
      if (local_6c < 0x1fffff) {
        local_70 = local_6c;
      }
      else {
        local_70 = 0x1fffff;
      }
      if (0 < (int)local_70) {
        RVar3 = axb_div_c(local_70,0x100,*(RK_S32 *)((long)ctx + 0x14));
        if ((*(int *)((long)ctx + 0x50) == *(int *)((long)ctx + 0x54)) && (mbrc->rlc_count != 0)) {
          for (scaler = 0; scaler < 10; scaler = scaler + 1) {
            iVar4 = (mbrc->cp_usage[scaler] * RVar3) / 0x100;
            if (iVar4 / 0x20 + 1 < 0xffff) {
              local_78 = iVar4 / 0x20 + 1;
            }
            else {
              local_78 = 0xffff;
            }
            coeffCntMax = local_78;
            if (local_78 < 0) {
              coeffCntMax = 0xffff;
            }
            mbrc->cp_target[scaler] = coeffCntMax;
          }
          coeffCntMax = axb_div_c(*(RK_S32 *)((long)ctx + 0x18),0x100,RVar2);
        }
        else {
          for (scaler = 0; scaler < 10; scaler = scaler + 1) {
            iVar4 = (RVar3 * (*(int *)((long)ctx + 0x48) * (scaler + 1) + 1)) / 0x100;
            if (iVar4 / 0x20 + 1 < 0xffff) {
              local_74 = iVar4 / 0x20 + 1;
            }
            else {
              local_74 = 0xffff;
            }
            coeffCntMax = local_74;
            if (local_74 < 0) {
              coeffCntMax = 0xffff;
            }
            mbrc->cp_target[scaler] = coeffCntMax;
          }
          coeffCntMax = axb_div_c(*(RK_S32 *)((long)ctx + 0x18),0x100,RVar2);
        }
        mbrc->cp_error[0] = coeffCntMax * -3;
        mbrc->cp_delta_qp[0] = 3;
        mbrc->cp_error[1] = coeffCntMax * -2;
        mbrc->cp_delta_qp[1] = 2;
        mbrc->cp_error[2] = -coeffCntMax;
        mbrc->cp_delta_qp[2] = 1;
        mbrc->cp_error[3] = coeffCntMax;
        mbrc->cp_delta_qp[3] = 0;
        mbrc->cp_error[4] = coeffCntMax << 1;
        mbrc->cp_delta_qp[4] = -1;
        mbrc->cp_error[5] = coeffCntMax * 3;
        mbrc->cp_delta_qp[5] = -2;
        mbrc->cp_error[6] = coeffCntMax << 2;
        mbrc->cp_delta_qp[6] = -3;
        for (scaler = 0; scaler < 7; scaler = scaler + 1) {
          RVar2 = mpp_clip(mbrc->cp_error[scaler] / 4,-0x8000,0x7fff);
          mbrc->cp_error[scaler] = RVar2;
        }
        mbrc->cp_distance_mbs = *(RK_S32 *)((long)ctx + 0x48);
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_mbrc_prepare(HalH264eVepuMbRcCtx ctx, HalH264eVepuMbRc *mbrc,
                                EncRcTask *rc_task)
{
    HalH264eVepuMbRcImpl *p = (HalH264eVepuMbRcImpl *)ctx;
    EncFrmStatus *frm = &rc_task->frm;
    EncRcTaskInfo *info = &rc_task->info;

    RK_S32 i;
    const RK_S32 sscale = 256;
    RK_S32 scaler, srcPrm;
    RK_S32 tmp, nonZeroTarget;
    RK_S32 coeffCntMax = p->mbs * 24 * 16;

    mbrc->qp_init = info->quality_target;
    mbrc->qp_min = info->quality_min;
    mbrc->qp_max = info->quality_max;
    mbrc->mad_qp_change = 0;
    mbrc->mad_threshold = 0;
    mbrc->cp_distance_mbs = 0;

    if (!p->mb_bit_rc_enable)
        return MPP_OK;

    p->pre_frame_type = p->frame_type;
    p->frame_type = (frm->is_intra) ? INTRA_FRAME : INTER_P_FRAME;

    if (mbrc->rlc_count == 0) {
        mbrc->rlc_count = 1;
    }

    srcPrm = axb_div_c(mbrc->out_strm_size * 8, 256, mbrc->rlc_count);
    /* Disable Mb Rc for Intra Slices, because coeffTarget will be wrong */
    if (frm->is_intra || srcPrm == 0)
        return 0;

    /* Required zero cnt */
    nonZeroTarget = axb_div_c(info->bit_target, 256, srcPrm);
    nonZeroTarget = MPP_MIN(coeffCntMax, MPP_MAX(0, nonZeroTarget));
    nonZeroTarget = MPP_MIN(0x7FFFFFFFU / 1024U, (RK_U32)nonZeroTarget);

    if (nonZeroTarget > 0) {
        scaler = axb_div_c(nonZeroTarget, sscale, (RK_S32) p->mbs);
    } else {
        return 0;
    }

    if ((p->frame_type != p->pre_frame_type) || (mbrc->rlc_count == 0)) {
        for (i = 0; i < VEPU_CHECK_POINTS_MAX; i++) {
            tmp = (scaler * (p->check_point_distance * (i + 1) + 1)) / sscale;
            tmp = MPP_MIN(WORD_CNT_MAX, tmp / 32 + 1);
            if (tmp < 0) tmp = WORD_CNT_MAX;    /* Detect overflow */
            mbrc->cp_target[i] = tmp; /* div32 for regs */
        }

        tmp = axb_div_c(p->bits_per_pic, 256, srcPrm);
    } else {
        for (i = 0; i < VEPU_CHECK_POINTS_MAX; i++) {
            tmp = (RK_S32) (mbrc->cp_usage[i] * scaler) / sscale;
            tmp = MPP_MIN(WORD_CNT_MAX, tmp / 32 + 1);
            if (tmp < 0) tmp = WORD_CNT_MAX;    /* Detect overflow */
            mbrc->cp_target[i] = tmp; /* div32 for regs */
        }
        tmp = axb_div_c(p->bits_per_pic, 256, srcPrm);
    }

    mbrc->cp_error[0] = -tmp * 3;
    mbrc->cp_delta_qp[0] = 3;
    mbrc->cp_error[1] = -tmp * 2;
    mbrc->cp_delta_qp[1] = 2;
    mbrc->cp_error[2] = -tmp * 1;
    mbrc->cp_delta_qp[2] = 1;
    mbrc->cp_error[3] = tmp * 1;
    mbrc->cp_delta_qp[3] = 0;
    mbrc->cp_error[4] = tmp * 2;
    mbrc->cp_delta_qp[4] = -1;
    mbrc->cp_error[5] = tmp * 3;
    mbrc->cp_delta_qp[5] = -2;
    mbrc->cp_error[6] = tmp * 4;
    mbrc->cp_delta_qp[6] = -3;

    for (i = 0; i < VEPU_CTRL_LEVELS; i++) {
        tmp = mbrc->cp_error[i];
        tmp = mpp_clip(tmp / 4, -32768, 32767);
        mbrc->cp_error[i] = tmp;
    }

    mbrc->cp_distance_mbs = p->check_point_distance;

    return MPP_OK;
}